

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# row_group_collection.cpp
# Opt level: O3

shared_ptr<duckdb::RowGroupCollection,_true> __thiscall
duckdb::RowGroupCollection::AddColumn
          (RowGroupCollection *this,ClientContext *context,ColumnDefinition *new_column,
          ExpressionExecutor *default_executor)

{
  _Head_base<0UL,_duckdb::Logger_*,_false> _Var1;
  _Head_base<0UL,_duckdb::RegisteredStateManager_*,_false> _Var2;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> _Var3;
  undefined8 uVar4;
  RowGroupCollection *pRVar5;
  reference this_00;
  type this_01;
  BaseStatistics *this_02;
  RowGroupSegmentTree *this_03;
  RowGroup *segment;
  ColumnDefinition *new_column_00;
  pointer this_04;
  BaseStatistics *other;
  ColumnData *this_05;
  RowGroupSegmentTree *this_06;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Vector *in_R8;
  size_type __n;
  shared_ptr<duckdb::RowGroupCollection,_true> sVar6;
  _Head_base<0UL,_duckdb::RowGroup_*,_false> local_170;
  ColumnDefinition *local_168;
  undefined1 local_160 [24];
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>
  lock;
  vector<duckdb::LogicalType,_true> new_types;
  LogicalType local_108;
  LogicalType local_f0;
  Vector default_vector;
  DataChunk dummy_chunk;
  
  _Var1._M_head_impl =
       (context->logger).super_unique_ptr<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t
       .super___uniq_ptr_impl<duckdb::Logger,_std::default_delete<duckdb::Logger>_>._M_t.
       super__Tuple_impl<0UL,_duckdb::Logger_*,_std::default_delete<duckdb::Logger>_>.
       super__Head_base<0UL,_duckdb::Logger_*,_false>._M_head_impl;
  _Var2._M_head_impl =
       (context->registered_state).
       super_unique_ptr<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
       ._M_t.
       super___uniq_ptr_impl<duckdb::RegisteredStateManager,_std::default_delete<duckdb::RegisteredStateManager>_>
       ._M_t.
       super__Tuple_impl<0UL,_duckdb::RegisteredStateManager_*,_std::default_delete<duckdb::RegisteredStateManager>_>
       .super__Head_base<0UL,_duckdb::RegisteredStateManager_*,_false>._M_head_impl;
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&new_types,
             (vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)
             &context->registered_state);
  local_168 = (ColumnDefinition *)default_executor;
  ColumnDefinition::GetType((LogicalType *)&default_vector,(ColumnDefinition *)default_executor);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::
  emplace_back<duckdb::LogicalType>
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&new_types,
             (LogicalType *)&default_vector);
  LogicalType::~LogicalType((LogicalType *)&default_vector);
  dummy_chunk.data.super_vector<duckdb::Vector,_std::allocator<duckdb::Vector>_>.
  super__Vector_base<duckdb::Vector,_std::allocator<duckdb::Vector>_>._M_impl.
  super__Vector_impl_data._M_start =
       (pointer)(context->db).internal.
                super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  default_vector.vector_type = FLAT_VECTOR;
  default_vector._1_7_ = 0;
  ::std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<duckdb::RowGroupCollection,std::allocator<duckdb::RowGroupCollection>,duckdb::shared_ptr<duckdb::DataTableInfo,true>&,duckdb::BlockManager&,duckdb::vector<duckdb::LogicalType,true>,unsigned_long&,unsigned_long,unsigned_long_const&>
            ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&default_vector.type,
             (RowGroupCollection **)&default_vector,
             (allocator<duckdb::RowGroupCollection> *)local_160,
             (shared_ptr<duckdb::DataTableInfo,_true> *)
             &(context->db).internal.
              super___shared_ptr<duckdb::DatabaseInstance,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
             (BlockManager *)
             (context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
             super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_ptr,&new_types,
             &(context->config).home_directory._M_string_length,(unsigned_long *)&dummy_chunk,
             (unsigned_long *)
             &(context->super_enable_shared_from_this<duckdb::ClientContext>).__weak_this_.internal.
              super___weak_ptr<duckdb::ClientContext,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  this->block_manager = (BlockManager *)default_vector._0_8_;
  this->row_group_size = default_vector.type._0_8_;
  if (default_vector.type._0_8_ != 0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      *(int *)(default_vector.type._0_8_ + 8) = *(int *)(default_vector.type._0_8_ + 8) + 1;
      UNLOCK();
      if (default_vector.type._0_8_ == 0) goto LAB_00615f0e;
    }
    else {
      *(int *)(default_vector.type._0_8_ + 8) = *(int *)(default_vector.type._0_8_ + 8) + 1;
    }
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)default_vector.type._0_8_);
  }
LAB_00615f0e:
  DataChunk::DataChunk(&dummy_chunk);
  ColumnDefinition::GetType(&local_f0,local_168);
  Vector::Vector(&default_vector,&local_f0,0x800);
  LogicalType::~LogicalType(&local_f0);
  pRVar5 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                     ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  ColumnDefinition::GetType((LogicalType *)local_160,local_168);
  TableStatistics::InitializeAddColumn
            (&pRVar5->stats,(TableStatistics *)&(context->config).enable_profiler,
             (LogicalType *)local_160);
  LogicalType::~LogicalType((LogicalType *)local_160);
  shared_ptr<duckdb::RowGroupCollection,_true>::operator->
            ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  TableStatistics::GetLock((TableStatistics *)&lock);
  pRVar5 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                     ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
  unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>,_true>::
  operator*(&lock);
  __n = ((long)_Var1._M_head_impl - (long)_Var2._M_head_impl >> 3) * -0x5555555555555555;
  this_00 = vector<duckdb::shared_ptr<duckdb::ColumnStatistics,_true>,_true>::operator[]
                      (&(pRVar5->stats).column_stats,__n);
  this_01 = shared_ptr<duckdb::ColumnStatistics,_true>::operator*(this_00);
  ColumnDefinition::GetType(&local_108,local_168);
  this_02 = (BaseStatistics *)operator_new(0x58);
  LogicalType::LogicalType((LogicalType *)local_160,&local_108);
  SegmentStatistics::SegmentStatistics((SegmentStatistics *)this_02,(LogicalType *)local_160);
  LogicalType::~LogicalType((LogicalType *)local_160);
  LogicalType::~LogicalType(&local_108);
  this_03 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->
                      ((shared_ptr<duckdb::RowGroupSegmentTree,_true> *)
                       &(context->config).home_directory.field_2);
  segment = SegmentTree<duckdb::RowGroup,_true>::GetRootSegment
                      (&this_03->super_SegmentTree<duckdb::RowGroup,_true>);
  for (; segment != (RowGroup *)0x0;
      segment = SegmentTree<duckdb::RowGroup,_true>::GetNextSegment
                          (&this_03->super_SegmentTree<duckdb::RowGroup,_true>,segment)) {
    new_column_00 =
         (ColumnDefinition *)
         shared_ptr<duckdb::RowGroupCollection,_true>::operator*
                   ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
    RowGroup::AddColumn((RowGroup *)local_160,(RowGroupCollection *)segment,new_column_00,
                        (ExpressionExecutor *)local_168,in_R8);
    this_04 = unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>::operator->
                        ((unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true>
                          *)local_160);
    other = ColumnStatistics::Statistics(this_01);
    this_05 = RowGroup::GetColumn(this_04,__n);
    ColumnData::MergeIntoStatistics(this_05,other);
    pRVar5 = shared_ptr<duckdb::RowGroupCollection,_true>::operator->
                       ((shared_ptr<duckdb::RowGroupCollection,_true> *)this);
    this_06 = shared_ptr<duckdb::RowGroupSegmentTree,_true>::operator->(&pRVar5->row_groups);
    local_170._M_head_impl = (RowGroup *)local_160._0_8_;
    local_160._0_8_ = (RowGroup *)0x0;
    SegmentTree<duckdb::RowGroup,_true>::AppendSegment
              (&this_06->super_SegmentTree<duckdb::RowGroup,_true>,
               (unique_ptr<duckdb::RowGroup,_std::default_delete<duckdb::RowGroup>,_true> *)
               &local_170);
    _Var3._M_head_impl = local_170._M_head_impl;
    if (local_170._M_head_impl != (RowGroup *)0x0) {
      RowGroup::~RowGroup(local_170._M_head_impl);
      operator_delete(_Var3._M_head_impl);
    }
    uVar4 = local_160._0_8_;
    local_170._M_head_impl = (RowGroup *)0x0;
    if ((RowGroup *)local_160._0_8_ != (RowGroup *)0x0) {
      RowGroup::~RowGroup((RowGroup *)local_160._0_8_);
      operator_delete((void *)uVar4);
    }
  }
  BaseStatistics::~BaseStatistics(this_02);
  operator_delete(this_02);
  ::std::unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
  ::~unique_ptr(&lock.
                 super_unique_ptr<duckdb::TableStatisticsLock,_std::default_delete<duckdb::TableStatisticsLock>_>
               );
  if (default_vector.auxiliary.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (default_vector.auxiliary.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (default_vector.buffer.internal.
      super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (default_vector.buffer.internal.
               super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
  }
  if (default_vector.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
      super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (default_vector.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
               internal.
               super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
               ._M_refcount._M_pi);
  }
  LogicalType::~LogicalType(&default_vector.type);
  DataChunk::~DataChunk(&dummy_chunk);
  ::std::vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_>::~vector
            ((vector<duckdb::LogicalType,_std::allocator<duckdb::LogicalType>_> *)&new_types);
  sVar6.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = extraout_RDX._M_pi;
  sVar6.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       this;
  return (shared_ptr<duckdb::RowGroupCollection,_true>)
         sVar6.internal.super___shared_ptr<duckdb::RowGroupCollection,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

shared_ptr<RowGroupCollection> RowGroupCollection::AddColumn(ClientContext &context, ColumnDefinition &new_column,
                                                             ExpressionExecutor &default_executor) {
	idx_t new_column_idx = types.size();
	auto new_types = types;
	new_types.push_back(new_column.GetType());
	auto result = make_shared_ptr<RowGroupCollection>(info, block_manager, std::move(new_types), row_start,
	                                                  total_rows.load(), row_group_size);

	DataChunk dummy_chunk;
	Vector default_vector(new_column.GetType());

	result->stats.InitializeAddColumn(stats, new_column.GetType());
	auto lock = result->stats.GetLock();
	auto &new_column_stats = result->stats.GetStats(*lock, new_column_idx);

	// fill the column with its DEFAULT value, or NULL if none is specified
	auto new_stats = make_uniq<SegmentStatistics>(new_column.GetType());
	for (auto &current_row_group : row_groups->Segments()) {
		auto new_row_group = current_row_group.AddColumn(*result, new_column, default_executor, default_vector);
		// merge in the statistics
		new_row_group->MergeIntoStatistics(new_column_idx, new_column_stats.Statistics());

		result->row_groups->AppendSegment(std::move(new_row_group));
	}

	return result;
}